

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::searchforth(Forth *this)

{
  iterator __position;
  
  __position._M_current =
       (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __position._M_current[-1] = this->widForthWordList;
    return;
  }
  if (__position._M_current !=
      (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = this->widForthWordList;
    (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
    return;
  }
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&this->searchOrder,__position,
             &this->widForthWordList);
  return;
}

Assistant:

void searchforth(){
			if(searchOrder.size()>0){
				searchOrder[searchOrder.size()-1]=widForthWordList;	
			}else {
				searchOrder.push_back(widForthWordList);
			}	
		}